

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

bool __thiscall
S2Builder::EdgeChainSimplifier::AvoidSites
          (EdgeChainSimplifier *this,VertexId v0,VertexId v1,VertexId v2,
          S2PolylineSimplifier *simplifier)

{
  bool bVar1;
  size_type_conflict sVar2;
  size_type_conflict sVar3;
  int iVar4;
  S2Point *x;
  S2Point *y;
  S2Point *y_00;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  *this_00;
  Iterator piVar5;
  EdgeId *pEVar6;
  ostream *poVar7;
  compact_array_base<int,_std::allocator<int>_> *pcVar8;
  const_iterator pvVar9;
  bool local_1e9;
  bool disc_on_left;
  S1ChordAngle local_190;
  S1ChordAngle r;
  S2Point *p;
  VertexId v;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  value_type *__range1_2;
  S2LogMessage local_148;
  S2LogMessageVoidify local_135;
  int local_134;
  Iterator piStack_130;
  InputEdgeId id_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  IdSet *local_108;
  IdSet *__range2_1;
  Iterator local_f8;
  EdgeId e_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  VertexOutEdgeIds *__range1_1;
  InputEdgeId id;
  Iterator __end2;
  Iterator __begin2;
  IdSet *local_b0;
  IdSet *__range2;
  Iterator local_a0;
  EdgeId e;
  Iterator __end1;
  Iterator __begin1;
  VertexOutEdgeIds *__range1;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  *edge_sites;
  InputEdgeId best;
  S1ChordAngle local_58;
  S1ChordAngle r2;
  S1ChordAngle r1;
  S2Point *p2;
  S2Point *p1;
  S2Point *p0;
  S2PolylineSimplifier *simplifier_local;
  VertexId v2_local;
  VertexId v1_local;
  VertexId v0_local;
  EdgeChainSimplifier *this_local;
  
  x = Graph::vertex(this->g_,v0);
  y = Graph::vertex(this->g_,v1);
  y_00 = Graph::vertex(this->g_,v2);
  S1ChordAngle::S1ChordAngle(&r2,x,y);
  S1ChordAngle::S1ChordAngle(&local_58,x,y_00);
  bVar1 = ::operator<(local_58,r2);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = operator>=(local_58,(S1ChordAngle)
                                (this->builder_->min_edge_length_to_split_ca_).length2_);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      edge_sites._4_4_ = -1;
      this_00 = &this->builder_->edge_sites_;
      ___end1 = Graph::VertexOutMap::edge_ids(&this->out_,v1,v2);
      e = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1);
      local_a0 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1);
      while (bVar1 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e,&local_a0), bVar1)
      {
        pEVar6 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e);
        __range2._4_4_ = *pEVar6;
        Graph::input_edge_ids((IdSet *)&__begin2,this->g_,__range2._4_4_);
        local_b0 = (IdSet *)&__begin2;
        __end2 = IdSetLexicon::IdSet::begin(local_b0);
        piVar5 = IdSetLexicon::IdSet::end(local_b0);
        for (; __end2 != piVar5; __end2 = __end2 + 1) {
          iVar4 = *__end2;
          if (edge_sites._4_4_ < 0) {
LAB_003d17ee:
            edge_sites._4_4_ = iVar4;
          }
          else {
            pcVar8 = &std::
                      vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                      ::operator[](this_00,(long)iVar4)->
                      super_compact_array_base<int,_std::allocator<int>_>;
            sVar2 = gtl::compact_array_base<int,_std::allocator<int>_>::size(pcVar8);
            pcVar8 = &std::
                      vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                      ::operator[](this_00,(long)edge_sites._4_4_)->
                      super_compact_array_base<int,_std::allocator<int>_>;
            sVar3 = gtl::compact_array_base<int,_std::allocator<int>_>::size(pcVar8);
            if (sVar2 < sVar3) goto LAB_003d17ee;
          }
        }
        Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e);
      }
      ___end1_1 = Graph::VertexOutMap::edge_ids(&this->out_,v2,v1);
      e_1 = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1_1);
      local_f8 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1_1);
      while (bVar1 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e_1,&local_f8),
            bVar1) {
        pEVar6 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e_1);
        __range2_1._4_4_ = *pEVar6;
        Graph::input_edge_ids((IdSet *)&__begin2_1,this->g_,__range2_1._4_4_);
        local_108 = (IdSet *)&__begin2_1;
        __end2_1 = IdSetLexicon::IdSet::begin(local_108);
        piStack_130 = IdSetLexicon::IdSet::end(local_108);
        for (; __end2_1 != piStack_130; __end2_1 = __end2_1 + 1) {
          local_134 = *__end2_1;
          if (edge_sites._4_4_ < 0) {
LAB_003d195a:
            edge_sites._4_4_ = local_134;
          }
          else {
            pcVar8 = &std::
                      vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                      ::operator[](this_00,(long)local_134)->
                      super_compact_array_base<int,_std::allocator<int>_>;
            sVar2 = gtl::compact_array_base<int,_std::allocator<int>_>::size(pcVar8);
            pcVar8 = &std::
                      vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                      ::operator[](this_00,(long)edge_sites._4_4_)->
                      super_compact_array_base<int,_std::allocator<int>_>;
            sVar3 = gtl::compact_array_base<int,_std::allocator<int>_>::size(pcVar8);
            if (sVar2 < sVar3) goto LAB_003d195a;
          }
        }
        Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e_1);
      }
      if (edge_sites._4_4_ < 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_148,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                   ,0x684,kFatal,(ostream *)&std::cerr);
        poVar7 = S2LogMessage::stream(&local_148);
        poVar7 = std::operator<<(poVar7,"Check failed: (best) >= (0) ");
        S2LogMessageVoidify::operator&(&local_135,poVar7);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_148);
      }
      pcVar8 = &std::
                vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                ::operator[](this_00,(long)edge_sites._4_4_)->
                super_compact_array_base<int,_std::allocator<int>_>;
      __end1_2 = gtl::compact_array_base<int,_std::allocator<int>_>::begin(pcVar8);
      pvVar9 = gtl::compact_array_base<int,_std::allocator<int>_>::end(pcVar8);
      for (; __end1_2 != pvVar9; __end1_2 = __end1_2 + 1) {
        iVar4 = *__end1_2;
        if (((iVar4 != v0) && (iVar4 != v1)) && (iVar4 != v2)) {
          r.length2_ = (double)Graph::vertex(this->g_,iVar4);
          S1ChordAngle::S1ChordAngle(&local_190,x,(S2Point *)r.length2_);
          bVar1 = operator<=(local_190,r2);
          if ((!bVar1) && (bVar1 = operator>=(local_190,local_58), !bVar1)) {
            if (v1 == v0) {
              iVar4 = s2pred::Sign(y,y_00,(S2Point *)r.length2_);
              local_1e9 = 0 < iVar4;
            }
            else {
              local_1e9 = s2pred::OrderedCCW(x,y_00,(S2Point *)r.length2_,y);
            }
            bVar1 = S2PolylineSimplifier::AvoidDisc
                              (simplifier,(S2Point *)r.length2_,
                               (S1ChordAngle)(this->builder_->min_edge_site_separation_ca_).length2_
                               ,local_1e9);
            if (!bVar1) {
              return false;
            }
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::AvoidSites(
    VertexId v0, VertexId v1, VertexId v2,
    S2PolylineSimplifier* simplifier) const {
  const S2Point& p0 = g_.vertex(v0);
  const S2Point& p1 = g_.vertex(v1);
  const S2Point& p2 = g_.vertex(v2);
  S1ChordAngle r1(p0, p1);
  S1ChordAngle r2(p0, p2);

  // The distance from the start of the edge chain must increase monotonically
  // for each vertex, since we don't want to simplify chains that backtrack on
  // themselves (we want a parametric approximation, not a geometric one).
  if (r2 < r1) return false;

  // We also limit the maximum edge length in order to guarantee that the
  // simplified edge stays with max_edge_deviation() of all the input edges
  // that snap to it.
  if (r2 >= builder_.min_edge_length_to_split_ca_) return false;

  // Otherwise it is sufficient to consider the nearby sites (edge_sites_) for
  // a single input edge that snapped to (v1, v2) or (v2, v1).  This is
  // because each edge has a list of all sites within (max_edge_deviation +
  // min_edge_vertex_separation), and since the output edge is within
  // max_edge_deviation of all input edges, this list includes all sites
  // within min_edge_vertex_separation of the output edge.
  //
  // Usually there is only one edge to choose from, but it's not much more
  // effort to choose the edge with the shortest list of edge_sites_.
  InputEdgeId best = -1;
  const auto& edge_sites = builder_.edge_sites_;
  for (EdgeId e : out_.edge_ids(v1, v2)) {
    for (InputEdgeId id : g_.input_edge_ids(e)) {
      if (best < 0 || edge_sites[id].size() < edge_sites[best].size())
        best = id;
    }
  }
  for (EdgeId e : out_.edge_ids(v2, v1)) {
    for (InputEdgeId id : g_.input_edge_ids(e)) {
      if (best < 0 || edge_sites[id].size() < edge_sites[best].size())
        best = id;
    }
  }
  S2_DCHECK_GE(best, 0);  // Because there is at least one outgoing edge.

  for (VertexId v : edge_sites[best]) {
    // This test is optional since these sites are excluded below anyway.
    if (v == v0 || v == v1 || v == v2) continue;

    // We are only interested in sites whose distance from "p0" is in the
    // range (r1, r2).  Sites closer than "r1" have already been processed,
    // and sites further than "r2" aren't relevant yet.
    const S2Point& p = g_.vertex(v);
    S1ChordAngle r(p0, p);
    if (r <= r1 || r >= r2) continue;

    // We need to figure out whether this site is to the left or right of the
    // edge chain.  For the first edge this is easy.  Otherwise, since we are
    // only considering sites in the radius range (r1, r2), we can do this by
    // checking whether the site is to the left of the wedge (p0, p1, p2).
    bool disc_on_left = (v1 == v0) ? (s2pred::Sign(p1, p2, p) > 0)
                                   : s2pred::OrderedCCW(p0, p2, p, p1);
    if (!simplifier->AvoidDisc(p, builder_.min_edge_site_separation_ca_,
                               disc_on_left)) {
      return false;
    }
  }
  return true;
}